

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O1

void Abc_ObjPrintNeighborhood(Abc_Obj_t *pObj,int depth)

{
  uint *puVar1;
  int iVar2;
  Vec_Ptr_t *vNodes;
  void **ppvVar3;
  
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  vNodes->pArray = ppvVar3;
  Abc_ObjPrintNeighborhood_rec(pObj,vNodes,depth);
  while( true ) {
    iVar2 = vNodes->nSize;
    if (iVar2 == 0) {
      if (vNodes->pArray != (void **)0x0) {
        free(vNodes->pArray);
        vNodes->pArray = (void **)0x0;
      }
      free(vNodes);
      return;
    }
    if (iVar2 < 1) break;
    vNodes->nSize = iVar2 - 1U;
    puVar1 = (uint *)((long)vNodes->pArray[iVar2 - 1U] + 0x14);
    *puVar1 = *puVar1 & 0xffffffbf;
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x2e6,"void *Vec_PtrPop(Vec_Ptr_t *)");
}

Assistant:

void Abc_ObjPrintNeighborhood( Abc_Obj_t *pObj, int depth ) {
  Vec_Ptr_t *vNodes = Vec_PtrAlloc(100); 
  Abc_Obj_t *pObj2;

  Abc_ObjPrintNeighborhood_rec( pObj, vNodes, depth );

  while(Vec_PtrSize(vNodes)) {
    pObj2 = (Abc_Obj_t*)Vec_PtrPop(vNodes);
    pObj2->fMarkC = 0;
  }

  Vec_PtrFree(vNodes);
}